

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void __thiscall
cimg_library::CImg<char>::CImg(CImg<char> *this,uint size_x,uint size_y,uint size_z,uint size_c)

{
  char *pcVar1;
  ulong uVar2;
  
  this->_is_shared = false;
  uVar2 = (ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x;
  if (uVar2 == 0) {
    this->_data = (char *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
  }
  else {
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
    pcVar1 = (char *)operator_new__(uVar2);
    this->_data = pcVar1;
  }
  return;
}

Assistant:

explicit CImg(const unsigned int size_x, const unsigned int size_y=1,
                  const unsigned int size_z=1, const unsigned int size_c=1):
      _is_shared(false) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (siz) {
        _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
        try { _data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                      size_x,size_y,size_z,size_c);
        }
      } else { _width = _height = _depth = _spectrum = 0; _data = 0; }
    }